

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O1

TestCaseGroup * vkt::SpirVAssembly::createSConvertTests(TestContext *testCtx)

{
  TestNode *this;
  SpvAsmComputeShaderCase *this_00;
  pointer convertCase;
  string instruction;
  vector<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>
  testCases;
  string local_158;
  vector<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>
  local_138;
  TestContext *local_120;
  string local_118;
  ComputeShaderSpec local_f8;
  
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"OpSConvert","");
  this = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)this,testCtx,"sconvert","OpSConvert");
  local_138.
  super__Vector_base<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>
  ._M_impl.super__Vector_impl_data._M_start = (ConvertCase *)0x0;
  local_138.
  super__Vector_base<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>
  ._M_impl.super__Vector_impl_data._M_finish = (ConvertCase *)0x0;
  local_138.
  super__Vector_base<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_120 = testCtx;
  createSConvertCases(&local_138);
  if (local_138.
      super__Vector_base<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_138.
      super__Vector_base<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    convertCase = local_138.
                  super__Vector_base<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    do {
      ComputeShaderSpec::ComputeShaderSpec(&local_f8);
      getConvertCaseShaderStr(&local_118,&local_158,convertCase);
      std::__cxx11::string::_M_assign((string *)&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
      ::push_back(&local_f8.inputs,&convertCase->m_inputBuffer);
      std::
      vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
      ::push_back(&local_f8.outputs,&convertCase->m_outputBuffer);
      local_f8.numWorkGroups.m_data[0] = 1;
      local_f8.numWorkGroups.m_data[1] = 1;
      local_f8.numWorkGroups.m_data[2] = 1;
      this_00 = (SpvAsmComputeShaderCase *)operator_new(0x140);
      SpvAsmComputeShaderCase::SpvAsmComputeShaderCase
                (this_00,local_120,(convertCase->m_name)._M_dataplus._M_p,
                 "Convert integers with OpSConvert.",&local_f8,convertCase->m_features);
      tcu::TestNode::addChild(this,(TestNode *)this_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8.failMessage._M_dataplus._M_p != &local_f8.failMessage.field_2) {
        operator_delete(local_f8.failMessage._M_dataplus._M_p,
                        local_f8.failMessage.field_2._M_allocated_capacity + 1);
      }
      if (local_f8.specConstants.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f8.specConstants.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_f8.specConstants.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_f8.specConstants.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::
      vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
      ::~vector(&local_f8.outputs);
      std::
      vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
      ::~vector(&local_f8.inputs);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8.entryPoint._M_dataplus._M_p != &local_f8.entryPoint.field_2) {
        operator_delete(local_f8.entryPoint._M_dataplus._M_p,
                        local_f8.entryPoint.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8.assembly._M_dataplus._M_p != &local_f8.assembly.field_2) {
        operator_delete(local_f8.assembly._M_dataplus._M_p,
                        local_f8.assembly.field_2._M_allocated_capacity + 1);
      }
      convertCase = convertCase + 1;
    } while (convertCase !=
             local_138.
             super__Vector_base<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::vector<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>::
  ~vector(&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  return (TestCaseGroup *)this;
}

Assistant:

tcu::TestCaseGroup* createSConvertTests (tcu::TestContext& testCtx)
{
	const string instruction				("OpSConvert");
	de::MovePtr<tcu::TestCaseGroup>	group	(new tcu::TestCaseGroup(testCtx, "sconvert", "OpSConvert"));
	vector<ConvertCase>				testCases;
	createSConvertCases(testCases);

	for (vector<ConvertCase>::const_iterator test = testCases.begin(); test != testCases.end(); ++test)
	{
		ComputeShaderSpec	spec;

		spec.assembly = getConvertCaseShaderStr(instruction, *test);
		spec.inputs.push_back(test->m_inputBuffer);
		spec.outputs.push_back(test->m_outputBuffer);
		spec.numWorkGroups = IVec3(1, 1, 1);

		group->addChild(new SpvAsmComputeShaderCase(testCtx, test->m_name.c_str(), "Convert integers with OpSConvert.", spec, test->m_features));
	}

	return group.release();
}